

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O0

void __thiscall
snestistics::AnnotationResolver::add_vector_comment
          (AnnotationResolver *this,RomAccessor *rom,char *comment,uint16_t target_at)

{
  ushort *puVar1;
  undefined1 local_a0 [8];
  Annotation a;
  uint16_t target;
  uint16_t target_at_local;
  char *comment_local;
  RomAccessor *rom_local;
  AnnotationResolver *this_local;
  
  a.endOfRange._2_2_ = target_at;
  puVar1 = (ushort *)RomAccessor::evalPtr(rom,(uint)target_at);
  a.endOfRange._0_2_ = *puVar1;
  Annotation::Annotation((Annotation *)local_a0);
  local_a0._0_4_ = ANNOTATION_LINE;
  a._104_4_ = ZEXT24((ushort)a.endOfRange);
  a._108_4_ = a._104_4_;
  std::__cxx11::string::operator=((string *)&a.field_0x20,comment);
  a._64_1_ = 0;
  std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>::push_back
            (&this->_annotations,(value_type *)local_a0);
  Annotation::~Annotation((Annotation *)local_a0);
  return;
}

Assistant:

void AnnotationResolver::add_vector_comment(const RomAccessor &rom, const char * const comment, const uint16_t target_at) {
	uint16_t target = *(uint16_t*)rom.evalPtr(target_at);
	Annotation a;
	a.type = ANNOTATION_LINE;
	a.startOfRange = a.endOfRange = target;
	a.comment = comment;
	a.comment_is_multiline = false;
	_annotations.push_back(a);
}